

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

secplane_t * P_CheckSlopeWalk(AActor *actor,DVector2 *move)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  sector_t *psVar4;
  sector_t *psVar5;
  long lVar6;
  double *pdVar7;
  sector_t_conflict *psVar8;
  bool bVar9;
  msecnode_t *pmVar10;
  ulong uVar11;
  secplane_t *psVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  secplane_t *psVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  if (P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane == '\0') {
    P_CheckSlopeWalk();
  }
  uVar3 = (actor->flags).Value;
  if ((uVar3 >> 9 & 1) == 0) {
    psVar4 = actor->floorsector;
    dVar1 = (actor->__Pos).X;
    dVar2 = (actor->__Pos).Y;
    psVar5 = actor->Sector;
    dVar19 = 0.0;
    dVar20 = 0.0;
    if (psVar5->PortalGroup != psVar4->PortalGroup) {
      iVar15 = psVar4->PortalGroup * Displacements.size + psVar5->PortalGroup;
      dVar19 = Displacements.data.Array[iVar15].pos.X;
      dVar20 = Displacements.data.Array[iVar15].pos.Y;
    }
    dVar18 = ((psVar4->floorplane).normal.Y * (dVar20 + dVar2) +
             (psVar4->floorplane).normal.X * (dVar19 + dVar1) + (psVar4->floorplane).D) *
             (psVar4->floorplane).negiC;
    psVar16 = &psVar4->floorplane;
    uVar11 = (ulong)(psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar11 != 0) {
      lVar17 = 0;
      do {
        lVar6 = *(long *)((long)(psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                Array + lVar17);
        if ((~*(uint *)(lVar6 + 0x58) & 3) == 0) {
          pdVar7 = *(double **)(lVar6 + 0x28);
          dVar21 = *pdVar7;
          dVar23 = pdVar7[1];
          dVar22 = ((dVar20 + dVar2) * dVar23 + (dVar19 + dVar1) * dVar21 + pdVar7[3]) * pdVar7[4];
          if ((dVar18 < dVar22) && (dVar22 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
            P_CheckSlopeWalk::copyplane.normal.Z = pdVar7[2];
            P_CheckSlopeWalk::copyplane.D = pdVar7[3];
            P_CheckSlopeWalk::copyplane.negiC = pdVar7[4];
            P_CheckSlopeWalk::copyplane.normal.X = dVar21;
            P_CheckSlopeWalk::copyplane.normal.Y = dVar23;
            if (P_CheckSlopeWalk::copyplane.normal.Z < 0.0) {
              P_CheckSlopeWalk::copyplane.normal.Z = -P_CheckSlopeWalk::copyplane.normal.Z;
              P_CheckSlopeWalk::copyplane.D = -P_CheckSlopeWalk::copyplane.D;
              P_CheckSlopeWalk::copyplane.normal.X = -dVar21;
              P_CheckSlopeWalk::copyplane.normal.Y = -dVar23;
              P_CheckSlopeWalk::copyplane.negiC = -P_CheckSlopeWalk::copyplane.negiC;
            }
            psVar16 = &P_CheckSlopeWalk::copyplane;
            dVar18 = dVar22;
          }
        }
        lVar17 = lVar17 + 8;
      } while (uVar11 << 3 != lVar17);
    }
    psVar12 = psVar16;
    if (psVar4 != psVar5) {
      uVar11 = (ulong)(psVar5->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar11 == 0) {
        psVar12 = (secplane_t *)0x0;
      }
      else {
        psVar12 = (secplane_t *)0x0;
        lVar17 = 0;
        do {
          lVar6 = *(long *)((long)(psVar5->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                  Array + lVar17);
          if ((~*(uint *)(lVar6 + 0x58) & 3) == 0) {
            pdVar7 = *(double **)(lVar6 + 0x28);
            dVar19 = *pdVar7;
            dVar20 = pdVar7[1];
            dVar21 = (dVar2 * dVar20 + dVar1 * dVar19 + pdVar7[3]) * pdVar7[4];
            if ((dVar18 < dVar21) && (dVar21 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
              P_CheckSlopeWalk::copyplane.normal.Z = pdVar7[2];
              P_CheckSlopeWalk::copyplane.D = pdVar7[3];
              P_CheckSlopeWalk::copyplane.negiC = pdVar7[4];
              P_CheckSlopeWalk::copyplane.normal.X = dVar19;
              P_CheckSlopeWalk::copyplane.normal.Y = dVar20;
              if (P_CheckSlopeWalk::copyplane.normal.Z < 0.0) {
                P_CheckSlopeWalk::copyplane.normal.Z = -P_CheckSlopeWalk::copyplane.normal.Z;
                P_CheckSlopeWalk::copyplane.D = -P_CheckSlopeWalk::copyplane.D;
                P_CheckSlopeWalk::copyplane.normal.X = -dVar19;
                P_CheckSlopeWalk::copyplane.normal.Y = -dVar20;
                P_CheckSlopeWalk::copyplane.negiC = -P_CheckSlopeWalk::copyplane.negiC;
              }
              psVar16 = &P_CheckSlopeWalk::copyplane;
              dVar18 = dVar21;
            }
          }
          lVar17 = lVar17 + 8;
        } while (uVar11 << 3 != lVar17);
      }
    }
    if ((psVar4 == psVar5) || (dVar18 <= actor->floorz + 4.0)) {
      dVar19 = (actor->__Pos).Z;
      if (dVar19 - dVar18 <= 1.0) {
        dVar20 = (psVar16->normal).X;
        dVar21 = (psVar16->normal).Y;
        if ((((dVar20 != 0.0) || (NAN(dVar20))) || (dVar21 != 0.0)) || (NAN(dVar21))) {
          dVar22 = dVar1 + move->X;
          dVar24 = dVar2 + move->Y;
          dVar23 = (psVar16->normal).Z;
          dVar25 = dVar19 * dVar23 + dVar21 * dVar24 + dVar20 * dVar22 + psVar16->D;
          if (0.0 <= dVar25) {
            if (1.52587890625e-05 <= ABS(dVar19 - dVar18)) {
              return (secplane_t *)0x0;
            }
            if (dVar25 <= 0.0) {
              return (secplane_t *)0x0;
            }
            dVar22 = dVar22 + dVar20 * dVar25;
            dVar24 = dVar24 + dVar21 * dVar25;
          }
          else {
            if (dVar23 < 0.707122802734375) {
              if ((uVar3 >> 0xc & 1) != 0) {
                return psVar12;
              }
              if ((0.4714152018229167 < dVar23) &&
                 (pmVar10 = actor->touching_sectorlist, pmVar10 != (msecnode_t *)0x0)) {
                bVar13 = true;
                bVar14 = true;
                do {
                  psVar8 = pmVar10->m_sector;
                  if ((psVar8->floorplane).normal.Z < 0.707122802734375) {
LAB_0040f5e6:
                    bVar9 = true;
                  }
                  else {
                    dVar18 = 0.0;
                    dVar23 = 0.0;
                    if (psVar5->PortalGroup != psVar8->PortalGroup) {
                      iVar15 = psVar8->PortalGroup * Displacements.size + psVar5->PortalGroup;
                      dVar18 = Displacements.data.Array[iVar15].pos.X;
                      dVar23 = Displacements.data.Array[iVar15].pos.Y;
                    }
                    bVar9 = ((dVar23 + dVar2 + move->Y) * (psVar8->floorplane).normal.Y +
                            (dVar18 + dVar1 + move->X) * (psVar8->floorplane).normal.X +
                            (psVar8->floorplane).D) * (psVar8->floorplane).negiC <
                            dVar19 - actor->MaxStepHeight;
                    bVar14 = bVar13;
                    if (bVar9) goto LAB_0040f5e6;
                    bVar14 = false;
                    bVar13 = bVar14;
                  }
                } while ((bVar9) && (pmVar10 = pmVar10->m_tnext, pmVar10 != (msecnode_t *)0x0));
                if (!bVar14) {
                  return psVar12;
                }
              }
              move->Y = dVar21 + dVar21;
              move->X = dVar20 + dVar20;
              (actor->Vel).X = dVar20 + dVar20;
              (actor->Vel).Y = dVar21 + dVar21;
              return psVar12;
            }
            dVar22 = dVar22 - dVar20 * dVar25;
            dVar24 = dVar24 - dVar21 * dVar25;
          }
          move->Y = dVar24 - dVar2;
          move->X = dVar22 - dVar1;
          return psVar12;
        }
      }
    }
  }
  return (secplane_t *)0x0;
}

Assistant:

const secplane_t * P_CheckSlopeWalk(AActor *actor, DVector2 &move)
{
	static secplane_t copyplane;
	if (actor->flags & MF_NOGRAVITY)
	{
		return NULL;
	}

	DVector3 pos = actor->PosRelative(actor->floorsector);
	const secplane_t *plane = &actor->floorsector->floorplane;
	double planezhere = plane->ZatPoint(pos);

	for (auto rover : actor->floorsector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		double thisplanez = rover->top.plane->ZatPoint(pos);

		if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
		{
			copyplane = *rover->top.plane;
			if (copyplane.fC() < 0) copyplane.FlipVert();
			plane = &copyplane;
			planezhere = thisplanez;
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		for (auto rover : actor->Sector->e->XFloor.ffloors)
		{
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double thisplanez = rover->top.plane->ZatPoint(actor);

			if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
			{
				copyplane = *rover->top.plane;
				if (copyplane.fC() < 0) copyplane.FlipVert();
				plane = &copyplane;
				planezhere = thisplanez;
			}
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		// this additional check prevents sliding on sloped dropoffs
		if (planezhere>actor->floorz + 4)
			return NULL;
	}

	if (actor->Z() - planezhere > 1)
	{ // not on floor
		return NULL;
	}

	if (plane->isSlope())
	{
		DVector2 dest;
		double t;

		dest = actor->Pos() + move;
		t = (plane->Normal() | DVector3(dest, actor->Z())) + plane->fD();
		if (t < 0)
		{ // Desired location is behind (below) the plane
			// (i.e. Walking up the plane)
			if (plane->fC() < STEEPSLOPE)
			{ // Can't climb up slopes of ~45 degrees or more
				if (actor->flags & MF_NOCLIP)
				{
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
				else
				{
					const msecnode_t *node;
					bool dopush = true;

					if (plane->fC() > STEEPSLOPE * 2 / 3)
					{
						for (node = actor->touching_sectorlist; node; node = node->m_tnext)
						{
							sector_t *sec = node->m_sector;
							if (sec->floorplane.fC() >= STEEPSLOPE)
							{
								DVector3 pos = actor->PosRelative(sec) +move;

								if (sec->floorplane.ZatPoint(pos) >= actor->Z() - actor->MaxStepHeight)
								{
									dopush = false;
									break;
								}
							}
						}
					}
					if (dopush)
					{
						move = plane->Normal() * 2;
						actor->Vel.X = move.X;
						actor->Vel.Y = move.Y;
					}
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
			}
			// Slide the desired location along the plane's normal
			// so that it lies on the plane's surface
			dest -= plane->Normal() * t;
			move = dest - actor->Pos().XY();
			return (actor->floorsector == actor->Sector) ? plane : NULL;
		}
		else if (t > 0)
		{ // Desired location is in front of (above) the plane
			if (actor->isAtZ(planezhere))	// it is very important not to be too precise here.
			{ 
				// Actor's current spot is on/in the plane, so walk down it
				// Same principle as walking up, except reversed
				dest += plane->Normal() * t;
				move = dest - actor->Pos().XY();
				return (actor->floorsector == actor->Sector) ? plane : NULL;
			}
		}
	}
	return NULL;
}